

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O2

unique_ptr<Catch::ReporterRegistry::ReporterRegistryImpl>
Catch::Detail::make_unique<Catch::ReporterRegistry::ReporterRegistryImpl>(void)

{
  pointer puVar1;
  ReporterRegistryImpl *in_RDI;
  
  puVar1 = (pointer)operator_new(0x48);
  puVar1->m_ptr = (EventListenerFactory *)0x0;
  puVar1[1].m_ptr = (EventListenerFactory *)0x0;
  puVar1[2].m_ptr = (EventListenerFactory *)0x0;
  puVar1[3].m_ptr = (EventListenerFactory *)0x0;
  puVar1[4].m_ptr = (EventListenerFactory *)0x0;
  puVar1[5].m_ptr = (EventListenerFactory *)0x0;
  puVar1[6].m_ptr = (EventListenerFactory *)(puVar1 + 4);
  puVar1[7].m_ptr = (EventListenerFactory *)(puVar1 + 4);
  puVar1[8].m_ptr = (EventListenerFactory *)0x0;
  (in_RDI->listeners).
  super__Vector_base<Catch::Detail::unique_ptr<Catch::EventListenerFactory>,_std::allocator<Catch::Detail::unique_ptr<Catch::EventListenerFactory>_>_>
  ._M_impl.super__Vector_impl_data._M_start = puVar1;
  return (unique_ptr<Catch::ReporterRegistry::ReporterRegistryImpl>)in_RDI;
}

Assistant:

unique_ptr<T> make_unique(Args&&... args) {
        return unique_ptr<T>(new T(CATCH_FORWARD(args)...));
    }